

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlCtxtResetPush(xmlParserCtxtPtr ctxt,char *chunk,int size,char *filename,char *encoding)

{
  int iVar1;
  xmlParserInputPtr value;
  int iVar2;
  
  iVar2 = 1;
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    value = xmlNewPushInput(filename,chunk,size);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
      }
      else {
        iVar2 = 0;
        if (encoding != (char *)0x0) {
          xmlSwitchEncodingName(ctxt,encoding);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlCtxtResetPush(xmlParserCtxtPtr ctxt, const char *chunk,
                 int size, const char *filename, const char *encoding)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(1);

    xmlCtxtReset(ctxt);

    input = xmlNewPushInput(filename, chunk, size);
    if (input == NULL)
        return(1);

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(1);
    }

    if (encoding != NULL)
        xmlSwitchEncodingName(ctxt, encoding);

    return(0);
}